

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void clask::serve_file(response_writer *resp,request *req,string *path)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode __mode;
  pointer ppVar3;
  tm *__tp;
  char *__fmt;
  time_t tVar4;
  time_t tVar5;
  undefined8 uVar6;
  undefined1 local_26b8 [8];
  char buf [8192];
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  _Put_time<char> local_668;
  stringstream local_658 [8];
  stringstream date;
  basic_ostream<char,_std::char_traits<char>_> local_648 [383];
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  _Get_time<char> local_458;
  undefined1 auStack_448 [8];
  tm file_gmt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  tm *gmt;
  time_t local_3e0;
  time_t tt;
  file_time_type file_time;
  allocator<char> local_3a9;
  string local_3a8;
  unsigned_long local_388;
  uintmax_t size;
  string local_378;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_358;
  path local_350;
  string local_328;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_308;
  iterator it;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  ifstream local_288 [8];
  ifstream is;
  wchar_t *local_70;
  undefined1 local_68 [8];
  path fspath;
  wstring wpath;
  string *path_local;
  request *req_local;
  response_writer *resp_local;
  
  to_wstring((clask *)&fspath._M_cmpts,path);
  local_70 = (wchar_t *)std::__cxx11::wstring::c_str();
  std::filesystem::__cxx11::path::path<wchar_t_const*,std::filesystem::__cxx11::path>
            ((path *)local_68,&local_70,auto_format);
  __mode = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_288,(path *)local_68,__mode);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::filesystem::__cxx11::path::extension(&local_350,(path *)local_68);
    std::filesystem::__cxx11::path::string(&local_328,&local_350);
    local_308._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)content_types_abi_cxx11_,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::filesystem::__cxx11::path::~path(&local_350);
    local_358._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)content_types_abi_cxx11_);
    bVar2 = std::__detail::operator!=(&local_308,&local_358);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"content-type",(allocator<char> *)((long)&size + 7));
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_308);
      response_writer::set_header(resp,&local_378,&ppVar3->second);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
    }
    local_388 = std::filesystem::file_size((path *)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"content-length",&local_3a9);
    std::__cxx11::to_string((string *)&file_time,local_388);
    response_writer::set_header(resp,&local_3a8,(string *)&file_time);
    std::__cxx11::string::~string((string *)&file_time);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    tt = std::filesystem::last_write_time((path *)local_68);
    local_3e0 = to_time_t<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                          ((time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            )tt);
    __tp = gmtime(&local_3e0);
    __end1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&req->headers);
    h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&req->headers);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&h);
      if (!bVar2) break;
      file_gmt.tm_zone =
           (char *)__gnu_cxx::
                   __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator*(&__end1);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              file_gmt.tm_zone,"If-Modified-Since");
      if (bVar2) {
        file_gmt.tm_wday = 0;
        file_gmt.tm_yday = 0;
        file_gmt.tm_isdst = 0;
        file_gmt._36_4_ = 0;
        file_gmt.tm_hour = 0;
        file_gmt.tm_mday = 0;
        file_gmt.tm_mon = 0;
        file_gmt.tm_year = 0;
        auStack_448._0_4_ = 0;
        auStack_448._4_4_ = 0;
        file_gmt.tm_sec = 0;
        file_gmt.tm_min = 0;
        file_gmt.tm_gmtoff = 0;
        __fmt = (char *)std::__cxx11::string::c_str();
        local_458 = std::get_time<char>((tm *)auStack_448,__fmt);
        tVar4 = mktime((tm *)auStack_448);
        tVar5 = mktime(__tp);
        if (tVar4 <= tVar5) {
          response_writer::clear_header(resp);
          resp->code = 0x130;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_478,"content-type",&local_479);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a0,"text/plain",&local_4a1);
          response_writer::set_header(resp,&local_478,&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::allocator<char>::~allocator(&local_4a1);
          std::__cxx11::string::~string((string *)&local_478);
          std::allocator<char>::~allocator(&local_479);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_4c8,"Not Modified",&local_4c9);
          (**resp->_vptr_response_writer)(resp,local_4c8);
          std::__cxx11::string::~string(local_4c8);
          std::allocator<char>::~allocator(&local_4c9);
          it.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._0_4_ = 1;
          goto LAB_001123c6;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::stringstream::stringstream(local_658);
    local_668 = std::put_time<char>((tm *)__tp,"%a, %d %B %Y %H:%M:%S GMT");
    std::operator<<(local_648,local_668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,"last-modified",&local_689);
    std::__cxx11::stringstream::str();
    response_writer::set_header(resp,&local_688,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      std::istream::read((char *)local_288,(long)local_26b8);
      uVar6 = std::istream::gcount();
      (*resp->_vptr_response_writer[1])(resp,local_26b8,uVar6);
    }
    std::__cxx11::stringstream::~stringstream(local_658);
    it.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._0_4_ = 0;
  }
  else {
    response_writer::clear_header(resp);
    resp->code = 0x194;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"content-type",&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"text/plain",&local_2d1)
    ;
    response_writer::set_header(resp,&local_2a8,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2f8,"Not Found",
               (allocator<char> *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    (**resp->_vptr_response_writer)(resp,local_2f8);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    it.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._0_4_ = 1;
  }
LAB_001123c6:
  std::ifstream::~ifstream(local_288);
  std::filesystem::__cxx11::path::~path((path *)local_68);
  std::__cxx11::wstring::~wstring((wstring *)&fspath._M_cmpts);
  return;
}

Assistant:

inline void serve_file(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);
  std::filesystem::path fspath(wpath.c_str());

  std::ifstream is(fspath, std::ios::in | std::ios::binary);
  if (is.fail()) {
    resp.clear_header();
    resp.code = 404;
    resp.set_header("content-type", "text/plain");
    resp.write("Not Found");
    return;
  }

  auto it = content_types.find(fspath.extension().string());
  if (it != content_types.end()) {
    resp.set_header("content-type", it->second);
  }

  std::uintmax_t size = std::filesystem::file_size(fspath);
  resp.set_header("content-length", std::to_string(size));

  std::filesystem::file_time_type file_time = std::filesystem::last_write_time(fspath);
  std::time_t tt = to_time_t(file_time);
  std::tm *gmt = std::gmtime(&tt);
  for (auto& h : req.headers) {
    if (h.first == "If-Modified-Since") {
      std::tm file_gmt{};
      (void) std::get_time(&file_gmt, h.second.c_str());
      if (std::mktime(&file_gmt) <= std::mktime(gmt)) {
        resp.clear_header();
        resp.code = 304;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Modified");
        return;
      }
      break;
    }
  }

  std::stringstream date;
  date << std::put_time(gmt, "%a, %d %B %Y %H:%M:%S GMT");
  resp.set_header("last-modified", date.str());

  char buf[BUFSIZ];
  while (!is.eof()) {
    resp.write(buf, (size_t) is.read(buf, sizeof(buf)).gcount());
  }
}